

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddGroup.c
# Opt level: O2

int zddGroupSiftingBackward(DdManager *table,Move *moves,int size)

{
  DdSubtable *pDVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  Move *pMVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  bool bVar16;
  
  for (pMVar10 = moves; pMVar10 != (Move *)0x0; pMVar10 = pMVar10->next) {
    if (pMVar10->size < size) {
      size = pMVar10->size;
    }
  }
  while( true ) {
    if (moves == (Move *)0x0) {
      return 1;
    }
    if (moves->size == size) break;
    pDVar1 = table->subtableZ;
    uVar6 = moves->x;
    uVar15 = (ulong)uVar6;
    uVar8 = moves->y;
    uVar11 = (ulong)uVar8;
    if ((pDVar1[uVar15].next == uVar6) && (pDVar1[uVar11].next == uVar8)) {
      iVar2 = cuddZddSwapInPlace(table,uVar6,uVar8);
      if (iVar2 == 0) {
        return 0;
      }
    }
    else {
      uVar9 = pDVar1[(int)uVar6].next;
      do {
        uVar7 = (uint)uVar11;
        uVar11 = (ulong)pDVar1[(int)uVar7].next;
      } while (uVar7 < pDVar1[(int)uVar7].next);
      iVar3 = uVar6 - uVar9;
      iVar2 = uVar7 - uVar8;
      iVar4 = iVar3 + 1;
      if (iVar3 + 1 < 1) {
        iVar4 = 0;
      }
      iVar13 = -1;
      if (-1 < iVar2) {
        iVar13 = iVar2;
      }
      uVar6 = uVar8;
      for (iVar12 = 1; uVar11 = (ulong)uVar6, iVar14 = iVar4, iVar12 != iVar13 + 2;
          iVar12 = iVar12 + 1) {
        while (bVar16 = iVar14 != 0, iVar14 = iVar14 + -1, bVar16) {
          iVar5 = cuddZddSwapInPlace(table,(int)uVar15,(int)uVar11);
          if (iVar5 == 0) {
            return 0;
          }
          uVar6 = cuddZddNextLow(table,(int)uVar15);
          uVar11 = uVar15;
          uVar15 = (ulong)uVar6;
        }
        uVar6 = iVar12 + uVar8;
        uVar7 = cuddZddNextLow(table,uVar6);
        uVar15 = (ulong)uVar7;
      }
      uVar6 = uVar9;
      if (iVar2 < 1) {
        iVar2 = 0;
      }
      while( true ) {
        if (iVar2 == 0) break;
        uVar8 = cuddZddNextHigh(table,uVar6);
        table->subtableZ[(int)uVar6].next = uVar8;
        uVar6 = cuddZddNextHigh(table,uVar6);
        iVar2 = iVar2 + -1;
      }
      table->subtableZ[(int)uVar6].next = uVar9;
      uVar8 = cuddZddNextHigh(table,uVar6);
      uVar6 = uVar8;
      if (iVar3 < 1) {
        iVar3 = 0;
      }
      while( true ) {
        bVar16 = iVar3 == 0;
        iVar3 = iVar3 + -1;
        if (bVar16) break;
        uVar9 = cuddZddNextHigh(table,uVar6);
        table->subtableZ[(int)uVar6].next = uVar9;
        uVar6 = cuddZddNextHigh(table,uVar6);
      }
      table->subtableZ[(int)uVar6].next = uVar8;
    }
    moves = moves->next;
  }
  return 1;
}

Assistant:

static int
zddGroupSiftingBackward(
  DdManager * table,
  Move * moves,
  int  size)
{
    Move *move;
    int  res;


    for (move = moves; move != NULL; move = move->next) {
        if (move->size < size) {
            size = move->size;
        }
    }

    for (move = moves; move != NULL; move = move->next) {
        if (move->size == size) return(1);
        if ((table->subtableZ[move->x].next == move->x) &&
        (table->subtableZ[move->y].next == move->y)) {
            res = cuddZddSwapInPlace(table,(int)move->x,(int)move->y);
            if (!res) return(0);
#ifdef DD_DEBUG
            if (pr > 0) (void) fprintf(table->out,"zddGroupSiftingBackward:\n");
            assert(table->subtableZ[move->x].next == move->x);
            assert(table->subtableZ[move->y].next == move->y);
#endif
        } else { /* Group move necessary */
            res = zddGroupMoveBackward(table,(int)move->x,(int)move->y);
            if (!res) return(0);
        }
    }

    return(1);

}